

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line_parser.cpp
# Opt level: O1

size_t __thiscall
HawkTracer::ClientUtils::CommandLineParser::_get_max_option_length
          (CommandLineParser *this,size_t value_help_length)

{
  size_t sVar1;
  ulong uVar2;
  _Hash_node_base *p_Var3;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_HawkTracer::ClientUtils::CommandLineParser::OptionInfo,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_HawkTracer::ClientUtils::CommandLineParser::OptionInfo>_>_>
  *__range2;
  ulong uVar4;
  
  p_Var3 = (this->_registered_options)._M_h._M_before_begin._M_nxt;
  if (p_Var3 != (_Hash_node_base *)0x0) {
    uVar4 = 0;
    do {
      sVar1 = value_help_length;
      if (*(char *)&p_Var3[9]._M_nxt != '\0') {
        sVar1 = 0;
      }
      uVar2 = (long)&(p_Var3[2]._M_nxt)->_M_nxt + sVar1;
      if (uVar2 <= uVar4) {
        uVar2 = uVar4;
      }
      p_Var3 = p_Var3->_M_nxt;
      uVar4 = uVar2;
    } while (p_Var3 != (_Hash_node_base *)0x0);
    return uVar2;
  }
  return 0;
}

Assistant:

size_t CommandLineParser::_get_max_option_length(size_t value_help_length) const
{
    size_t max_option_length = 0;
    for (const auto& option : _registered_options)
    {
        size_t length = option.first.length();
        if (!option.second.is_flag)
        {
            length += value_help_length;
        }
        if (length > max_option_length)
        {
            max_option_length = length;
        }
    }

    return max_option_length;
}